

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

int Gia_ManSimParamRead(char *pFileName,int *pnIns,int *pnWords)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    return 0;
  }
  uVar5 = 0;
  uVar6 = 0;
  bVar1 = false;
  uVar3 = 0xffffffff;
  do {
    uVar2 = fgetc(__stream);
    if (uVar2 == 0x2e) {
      bVar1 = true;
    }
    else if (uVar2 == 0xffffffff) {
      if ((int)(uVar5 & 0x8000003f) < 1) {
        *pnIns = uVar3 - 1;
        uVar3 = uVar5 + 0x3f;
        if (-1 < (int)uVar5) {
          uVar3 = uVar5;
        }
        *pnWords = (int)uVar3 >> 6;
        fclose(__stream);
        return 1;
      }
      printf("The number of lines (%d) is not divisible by 64.\n",(ulong)uVar5);
LAB_007409c4:
      fclose(__stream);
      return 0;
    }
    uVar4 = uVar3;
    if (uVar2 == 10) {
      if (!bVar1) {
        uVar4 = uVar6;
        if ((uVar3 != 0xffffffff) && (uVar4 = uVar3, uVar3 != uVar6)) {
          printf("The number of symbols (%d) does not match other lines (%d).\n",(ulong)uVar6,
                 (ulong)uVar3);
          goto LAB_007409c4;
        }
        uVar5 = uVar5 + 1;
        uVar6 = 0;
      }
      bVar1 = false;
    }
    uVar6 = uVar6 + ((uVar2 & 0xfffffffe) == 0x30 && !bVar1);
    uVar3 = uVar4;
  } while( true );
}

Assistant:

int Gia_ManSimParamRead( char * pFileName, int * pnIns, int * pnWords )
{
    int c, nIns = -1, nLines = 0, Count = 0, fReadDot = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return 0;
    }
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '.' )
            fReadDot = 1;
        if ( c == '\n' )
        {
            if ( !fReadDot )
            {
                if ( nIns == -1 )
                    nIns = Count;
                else if ( nIns != Count )
                {
                    printf( "The number of symbols (%d) does not match other lines (%d).\n", Count, nIns );
                    fclose( pFile );
                    return 0;
                }
                Count = 0;
                nLines++;
            }
            fReadDot = 0;
        }
        if ( fReadDot )
            continue;
        if ( c != '0' && c != '1' )
            continue;
        Count++;
    }
    if ( nLines % 64 > 0 )
    {
        printf( "The number of lines (%d) is not divisible by 64.\n", nLines );
        fclose( pFile );
        return 0;
    }
    *pnIns = nIns - 1;
    *pnWords = nLines / 64;
    //printf( "Expecting %d inputs and %d words of simulation data.\n", *pnIns, *pnWords );
    fclose( pFile );
    return 1;
}